

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

iterator * __thiscall
pybind11::detail::values_and_holders::find
          (iterator *__return_storage_ptr__,values_and_holders *this,type_info *find_type)

{
  bool bVar1;
  value_and_holder *pvVar2;
  bool bVar3;
  undefined1 local_48 [8];
  iterator endit;
  type_info *find_type_local;
  values_and_holders *this_local;
  
  endit.curr.vh = &find_type->type;
  begin(__return_storage_ptr__,this);
  end((iterator *)local_48,this);
  while( true ) {
    bVar1 = iterator::operator!=(__return_storage_ptr__,(iterator *)local_48);
    bVar3 = false;
    if (bVar1) {
      pvVar2 = iterator::operator->(__return_storage_ptr__);
      bVar3 = pvVar2->type != (type_info *)endit.curr.vh;
    }
    if (!bVar3) break;
    iterator::operator++(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

iterator find(const type_info *find_type) {
        auto it = begin(), endit = end();
        while (it != endit && it->type != find_type) {
            ++it;
        }
        return it;
    }